

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

BranchNode *
HighsHashTree<int,_int>::addChildToBranchNode(BranchNode *branch,uint8_t hashValue,int location)

{
  int iVar1;
  long lVar2;
  BranchNode *__dest;
  ulong uVar3;
  ulong __n;
  
  iVar1 = (int)POPCOUNT((branch->occupation).occupation << (~hashValue & 0x3f));
  lVar2 = (long)(iVar1 + location);
  uVar3 = lVar2 * 8 + 0x4fU & 0xffffffffffffffc0;
  __n = (ulong)(uint)(iVar1 << 3);
  if (uVar3 == (lVar2 * 8 + 0x47U & 0xffffffffffffffc0)) {
    memmove(branch[1].child + (long)location + -1,branch->child + location,__n);
    __dest = branch;
  }
  else {
    __dest = (BranchNode *)operator_new(uVar3);
    lVar2 = (long)location;
    memcpy(__dest,branch,lVar2 * 8 + 8);
    memcpy(__dest[1].child + lVar2 + -1,branch->child + lVar2,__n);
    operator_delete(branch);
  }
  return __dest;
}

Assistant:

static BranchNode* addChildToBranchNode(BranchNode* branch, uint8_t hashValue,
                                          int location) {
    int rightChilds = branch->occupation.num_set_after(hashValue);
    assert(rightChilds + location == branch->occupation.num_set());

    size_t newSize = getBranchNodeSize(location + rightChilds + 1);
    size_t rightSize = rightChilds * sizeof(NodePtr);

    if (newSize == getBranchNodeSize(location + rightChilds)) {
      memmove(&branch->child[location + 1], &branch->child[location],
              rightSize);

      return branch;
    }

    BranchNode* newBranch = (BranchNode*)::operator new(newSize);
    // sizeof(Branch) already contains the size for 1 pointer. So we just
    // need to add the left and right sizes up for the number of
    // additional pointers
    size_t leftSize = sizeof(BranchNode) + (location - 1) * sizeof(NodePtr);

    memcpy(newBranch, branch, leftSize);
    memcpy(&newBranch->child[location + 1], &branch->child[location],
           rightSize);

    destroyBranchingNode(branch);

    return newBranch;
  }